

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.h
# Opt level: O0

void __thiscall SQVM::GrowCallStack(SQVM *this)

{
  CallInfo *pCVar1;
  long in_RDI;
  SQInteger newsize;
  SQUnsignedInteger newsize_00;
  sqvector<SQVM::CallInfo> *this_00;
  sqvector<SQVM::CallInfo> local_58;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  SQUnsignedInteger local_10;
  
  newsize_00 = *(long *)(in_RDI + 0xd0) * 2;
  pCVar1 = (CallInfo *)(in_RDI + 0xd8);
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_58._allocated = 0;
  uStack_40 = 0;
  local_58._vals = (CallInfo *)0x0;
  local_58._size = 0;
  local_18 = 0;
  this_00 = &local_58;
  local_10 = newsize_00;
  CallInfo::CallInfo((CallInfo *)0x138cce);
  sqvector<SQVM::CallInfo>::resize(this_00,newsize_00,pCVar1);
  CallInfo::~CallInfo((CallInfo *)0x138cee);
  pCVar1 = sqvector<SQVM::CallInfo>::operator[]((sqvector<SQVM::CallInfo> *)(in_RDI + 0xd8),0);
  *(CallInfo **)(in_RDI + 0xc0) = pCVar1;
  *(SQUnsignedInteger *)(in_RDI + 0xd0) = local_10;
  return;
}

Assistant:

void GrowCallStack() {
        SQInteger newsize = _alloccallsstacksize*2;
        _callstackdata.resize(newsize);
        _callsstack = &_callstackdata[0];
        _alloccallsstacksize = newsize;
    }